

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::shl(bigint *this,size_t n)

{
  bool bVar1;
  ulong in_RSI;
  size_t div;
  size_t rem;
  bool local_1;
  
  if (((in_RSI & 0x3f) == 0) || (bVar1 = shl_bits((bigint *)rem,div), bVar1)) {
    if ((in_RSI >> 6 == 0) || (bVar1 = shl_limbs(this,n), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool shl(size_t n) noexcept {
    size_t rem = n % limb_bits;
    size_t div = n / limb_bits;
    if (rem != 0) {
      FASTFLOAT_TRY(shl_bits(rem));
    }
    if (div != 0) {
      FASTFLOAT_TRY(shl_limbs(div));
    }
    return true;
  }